

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
std::tr1::
tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
::tuple(tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
        *this,tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
              *t)

{
  Matcher<char_*> *in_RDI;
  Matcher<char_*> *in_stack_ffffffffffffffe0;
  
  testing::Matcher<char_*>::Matcher(in_stack_ffffffffffffffe0,in_RDI);
  testing::Matcher<unsigned_long>::Matcher
            ((Matcher<unsigned_long> *)in_stack_ffffffffffffffe0,(Matcher<unsigned_long> *)in_RDI);
  return;
}

Assistant:

tuple(const tuple& t) : f0_(t.f0_), f1_(t.f1_) {}